

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void __thiscall ImGuiViewportP::ImGuiViewportP(ImGuiViewportP *this)

{
  (this->_ImGuiViewport).PlatformHandleRaw = (void *)0x0;
  (this->_ImGuiViewport).PlatformRequestMove = false;
  (this->_ImGuiViewport).PlatformRequestResize = false;
  (this->_ImGuiViewport).PlatformRequestClose = false;
  *(undefined5 *)&(this->_ImGuiViewport).field_0x5b = 0;
  (this->_ImGuiViewport).PlatformUserData = (void *)0x0;
  (this->_ImGuiViewport).PlatformHandle = (void *)0x0;
  (this->_ImGuiViewport).DrawData = (ImDrawData *)0x0;
  (this->_ImGuiViewport).RendererUserData = (void *)0x0;
  (this->_ImGuiViewport).WorkSize.x = 0.0;
  (this->_ImGuiViewport).WorkSize.y = 0.0;
  (this->_ImGuiViewport).DpiScale = 0.0;
  (this->_ImGuiViewport).ParentViewportId = 0;
  (this->_ImGuiViewport).Size.x = 0.0;
  (this->_ImGuiViewport).Size.y = 0.0;
  (this->_ImGuiViewport).WorkPos.x = 0.0;
  (this->_ImGuiViewport).WorkPos.y = 0.0;
  (this->_ImGuiViewport).ID = 0;
  (this->_ImGuiViewport).Flags = 0;
  (this->_ImGuiViewport).Pos.x = 0.0;
  (this->_ImGuiViewport).Pos.y = 0.0;
  memset(this->DrawLists + 1,0,0x90);
  this->Window = (ImGuiWindow *)0xffffffffffffffff;
  *(undefined8 *)&(this->_ImGuiViewport).field_0x5c = 0xffffffffffffffff;
  this->LastFrameActive = -1;
  this->LastFrontMostStampCount = 0;
  this->LastNameHash = 0;
  (this->LastPos).x = 0.0;
  *(undefined8 *)&(this->LastPos).y = 0x3f8000003f800000;
  *(undefined2 *)&this->LastAlpha = 0xffff;
  *(undefined1 *)((long)&this->LastAlpha + 2) = 0;
  this->PlatformMonitor = 0;
  this->PlatformWindowCreated = false;
  *(undefined5 *)&this->field_0x83 = 0;
  this->DrawListsLastFrame[0] = 0;
  this->DrawListsLastFrame[1] = 0;
  this->DrawLists[0] = (ImDrawList *)0x0;
  (this->LastPlatformSize).x = 3.4028235e+38;
  (this->LastPlatformSize).y = 3.4028235e+38;
  (this->DrawDataBuilder).Layers[1].Data = (ImDrawList **)0x7f7fffff7f7fffff;
  (this->LastPlatformPos).x = 3.4028235e+38;
  (this->LastPlatformPos).y = 3.4028235e+38;
  return;
}

Assistant:

ImGuiViewportP()                    { Idx = -1; LastFrameActive = DrawListsLastFrame[0] = DrawListsLastFrame[1] = LastFrontMostStampCount = -1; LastNameHash = 0; Alpha = LastAlpha = 1.0f; PlatformMonitor = -1; PlatformWindowCreated = false; Window = NULL; DrawLists[0] = DrawLists[1] = NULL; LastPlatformPos = LastPlatformSize = LastRendererSize = ImVec2(FLT_MAX, FLT_MAX); }